

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestContext.cpp
# Opt level: O0

void __thiscall
tcu::TestContext::TestContext
          (TestContext *this,Platform *platform,Archive *rootArchive,TestLog *log,
          CommandLine *cmdLine,qpWatchDog *watchDog)

{
  qpWatchDog *watchDog_local;
  CommandLine *cmdLine_local;
  TestLog *log_local;
  Archive *rootArchive_local;
  Platform *platform_local;
  TestContext *this_local;
  
  this->m_platform = platform;
  this->m_rootArchive = rootArchive;
  this->m_log = log;
  this->m_cmdLine = cmdLine;
  this->m_watchDog = watchDog;
  this->m_curArchive = (Archive *)0x0;
  this->m_testResult = QP_TEST_RESULT_LAST;
  std::__cxx11::string::string((string *)&this->m_testResultDesc);
  this->m_terminateAfter = false;
  setCurrentArchive(this,this->m_rootArchive);
  return;
}

Assistant:

TestContext::TestContext (
	Platform&			platform,
	Archive&			rootArchive,
	TestLog&			log,
	const CommandLine&	cmdLine,
	qpWatchDog*			watchDog)
	: m_platform		(platform)
	, m_rootArchive		(rootArchive)
	, m_log				(log)
	, m_cmdLine			(cmdLine)
	, m_watchDog		(watchDog)
	, m_curArchive		(DE_NULL)
	, m_testResult		(QP_TEST_RESULT_LAST)
	, m_terminateAfter	(false)
{
	setCurrentArchive(m_rootArchive);
}